

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_mixture_modeling.cc
# Opt level: O0

bool anon_unknown.dwarf_1367d::CheckGmm
               (int num_mixture,int length,vector<double,_std::allocator<double>_> *weights,
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *mean_vectors,
               vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
               *covariance_matrices)

{
  int iVar1;
  size_type sVar2;
  const_reference this;
  const_reference this_00;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  int in_ESI;
  int in_EDI;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *in_R8;
  int k_1;
  int k;
  int local_30;
  int local_2c;
  bool local_1;
  
  sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
  if (sVar2 == (long)in_EDI) {
    sVar2 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(in_RCX);
    if (sVar2 == (long)in_EDI) {
      for (local_2c = 0; local_2c < in_EDI; local_2c = local_2c + 1) {
        this = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](in_RCX,(long)local_2c);
        sVar2 = std::vector<double,_std::allocator<double>_>::size(this);
        if (sVar2 != (long)in_ESI) {
          return false;
        }
      }
      sVar2 = std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::size
                        (in_R8);
      if (sVar2 == (long)in_EDI) {
        for (local_30 = 0; local_30 < in_EDI; local_30 = local_30 + 1) {
          this_00 = std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::
                    operator[](in_R8,(long)local_30);
          iVar1 = sptk::SymmetricMatrix::GetNumDimension(this_00);
          if (iVar1 != in_ESI) {
            return false;
          }
        }
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool CheckGmm(int num_mixture, int length, const std::vector<double>& weights,
              const std::vector<std::vector<double> >& mean_vectors,
              const std::vector<sptk::SymmetricMatrix>& covariance_matrices) {
  if (weights.size() != static_cast<std::size_t>(num_mixture)) {
    return false;
  }
  if (mean_vectors.size() != static_cast<std::size_t>(num_mixture)) {
    return false;
  }
  for (int k(0); k < num_mixture; ++k) {
    if (mean_vectors[k].size() != static_cast<std::size_t>(length)) {
      return false;
    }
  }
  if (covariance_matrices.size() != static_cast<std::size_t>(num_mixture)) {
    return false;
  }
  for (int k(0); k < num_mixture; ++k) {
    if (covariance_matrices[k].GetNumDimension() != length) {
      return false;
    }
  }
  return true;
}